

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_symbolEncodingTypeStats_t *
ZSTD_buildSequencesStatistics
          (ZSTD_symbolEncodingTypeStats_t *__return_storage_ptr__,seqStore_t *seqStorePtr,
          size_t nbSeq,ZSTD_fseCTables_t *prevEntropy,ZSTD_fseCTables_t *nextEntropy,BYTE *dst,
          BYTE *dstEnd,ZSTD_strategy strategy,uint *countWorkspace,void *entropyWorkspace,
          size_t entropyWkspSize)

{
  int iVar1;
  symbolEncodingType_e sVar2;
  uint uVar3;
  size_t sVar4;
  size_t countSize_2;
  size_t mostFrequent_2;
  size_t sStack_d0;
  uint max_2;
  size_t countSize_1;
  size_t sStack_c0;
  ZSTD_defaultPolicy_e defaultPolicy;
  size_t mostFrequent_1;
  size_t sStack_b0;
  uint max_1;
  size_t countSize;
  size_t mostFrequent;
  BYTE *pBStack_98;
  uint max;
  BYTE *mlCodeTable;
  BYTE *llCodeTable;
  BYTE *ofCodeTable;
  FSE_CTable *CTable_MatchLength;
  FSE_CTable *CTable_OffsetBits;
  FSE_CTable *CTable_LitLength;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *dst_local;
  ZSTD_fseCTables_t *nextEntropy_local;
  ZSTD_fseCTables_t *prevEntropy_local;
  size_t nbSeq_local;
  seqStore_t *seqStorePtr_local;
  
  op = dstEnd;
  CTable_OffsetBits = nextEntropy->litlengthCTable;
  ofCodeTable = (BYTE *)nextEntropy->matchlengthCTable;
  llCodeTable = seqStorePtr->ofCode;
  mlCodeTable = seqStorePtr->llCode;
  pBStack_98 = seqStorePtr->mlCode;
  __return_storage_ptr__->lastCountSize = 0;
  CTable_MatchLength = nextEntropy->offcodeCTable;
  CTable_LitLength = (FSE_CTable *)dst;
  oend = dst;
  ostart = dst;
  dst_local = (BYTE *)nextEntropy;
  nextEntropy_local = prevEntropy;
  prevEntropy_local = (ZSTD_fseCTables_t *)nbSeq;
  nbSeq_local = (size_t)seqStorePtr;
  iVar1 = ZSTD_seqToCodes(seqStorePtr);
  __return_storage_ptr__->longOffsets = iVar1;
  if (op < CTable_LitLength) {
    __assert_fail("op <= oend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xaa7,
                  "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                 );
  }
  if (prevEntropy_local == (ZSTD_fseCTables_t *)0x0) {
    __assert_fail("nbSeq != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xaa8,
                  "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                 );
  }
  mostFrequent._4_4_ = 0x23;
  countSize = HIST_countFast_wksp(countWorkspace,(uint *)((long)&mostFrequent + 4),mlCodeTable,
                                  (size_t)prevEntropy_local,entropyWorkspace,entropyWkspSize);
  *(FSE_repeat *)(dst_local + 0xddc) = nextEntropy_local->litlength_repeatMode;
  sVar2 = ZSTD_selectEncodingType
                    ((FSE_repeat *)(dst_local + 0xddc),countWorkspace,mostFrequent._4_4_,countSize,
                     (size_t)prevEntropy_local,9,nextEntropy_local->litlengthCTable,LL_defaultNorm,6
                     ,ZSTD_defaultAllowed,strategy);
  __return_storage_ptr__->LLtype = sVar2;
  if ((__return_storage_ptr__->LLtype < 2) && (*(int *)(dst_local + 0xddc) != 0)) {
    __assert_fail("!(stats.LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xab4,
                  "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                 );
  }
  sStack_b0 = ZSTD_buildCTable(CTable_LitLength,(long)op - (long)CTable_LitLength,CTable_OffsetBits,
                               9,__return_storage_ptr__->LLtype,countWorkspace,mostFrequent._4_4_,
                               mlCodeTable,(size_t)prevEntropy_local,LL_defaultNorm,6,0x23,
                               nextEntropy_local->litlengthCTable,0x524,entropyWorkspace,
                               entropyWkspSize);
  uVar3 = ERR_isError(sStack_b0);
  if (uVar3 == 0) {
    if (__return_storage_ptr__->LLtype == 2) {
      __return_storage_ptr__->lastCountSize = sStack_b0;
    }
    CTable_LitLength = (FSE_CTable *)(sStack_b0 + (long)CTable_LitLength);
    if (op < CTable_LitLength) {
      __assert_fail("op <= oend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xac5,
                    "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                   );
    }
    mostFrequent_1._4_4_ = 0x1f;
    sStack_c0 = HIST_countFast_wksp(countWorkspace,(uint *)((long)&mostFrequent_1 + 4),llCodeTable,
                                    (size_t)prevEntropy_local,entropyWorkspace,entropyWkspSize);
    countSize_1._4_4_ = (ZSTD_defaultPolicy_e)(mostFrequent_1._4_4_ < 0x1d);
    *(FSE_repeat *)(dst_local + 0xdd4) = nextEntropy_local->offcode_repeatMode;
    sVar2 = ZSTD_selectEncodingType
                      ((FSE_repeat *)(dst_local + 0xdd4),countWorkspace,mostFrequent_1._4_4_,
                       sStack_c0,(size_t)prevEntropy_local,8,nextEntropy_local->offcodeCTable,
                       OF_defaultNorm,5,countSize_1._4_4_,strategy);
    __return_storage_ptr__->Offtype = sVar2;
    if ((__return_storage_ptr__->Offtype < 2) && (*(int *)(dst_local + 0xdd4) != 0)) {
      __assert_fail("!(stats.Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xad4,
                    "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                   );
    }
    sStack_d0 = ZSTD_buildCTable(CTable_LitLength,(long)op - (long)CTable_LitLength,
                                 CTable_MatchLength,8,__return_storage_ptr__->Offtype,countWorkspace
                                 ,mostFrequent_1._4_4_,llCodeTable,(size_t)prevEntropy_local,
                                 OF_defaultNorm,5,0x1c,nextEntropy_local->offcodeCTable,0x304,
                                 entropyWorkspace,entropyWkspSize);
    uVar3 = ERR_isError(sStack_d0);
    if (uVar3 == 0) {
      if (__return_storage_ptr__->Offtype == 2) {
        __return_storage_ptr__->lastCountSize = sStack_d0;
      }
      CTable_LitLength = (FSE_CTable *)(sStack_d0 + (long)CTable_LitLength);
      if (op < CTable_LitLength) {
        __assert_fail("op <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xae5,
                      "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                     );
      }
      mostFrequent_2._4_4_ = 0x34;
      sVar4 = HIST_countFast_wksp(countWorkspace,(uint *)((long)&mostFrequent_2 + 4),pBStack_98,
                                  (size_t)prevEntropy_local,entropyWorkspace,entropyWkspSize);
      *(FSE_repeat *)(dst_local + 0xdd8) = nextEntropy_local->matchlength_repeatMode;
      sVar2 = ZSTD_selectEncodingType
                        ((FSE_repeat *)(dst_local + 0xdd8),countWorkspace,mostFrequent_2._4_4_,sVar4
                         ,(size_t)prevEntropy_local,9,nextEntropy_local->matchlengthCTable,
                         ML_defaultNorm,6,ZSTD_defaultAllowed,strategy);
      __return_storage_ptr__->MLtype = sVar2;
      if ((__return_storage_ptr__->MLtype < 2) && (*(int *)(dst_local + 0xdd8) != 0)) {
        __assert_fail("!(stats.MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xaf2,
                      "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                     );
      }
      sVar4 = ZSTD_buildCTable(CTable_LitLength,(long)op - (long)CTable_LitLength,
                               (FSE_CTable *)ofCodeTable,9,__return_storage_ptr__->MLtype,
                               countWorkspace,mostFrequent_2._4_4_,pBStack_98,
                               (size_t)prevEntropy_local,ML_defaultNorm,6,0x34,
                               nextEntropy_local->matchlengthCTable,0x5ac,entropyWorkspace,
                               entropyWkspSize);
      uVar3 = ERR_isError(sVar4);
      if (uVar3 == 0) {
        if (__return_storage_ptr__->MLtype == 2) {
          __return_storage_ptr__->lastCountSize = sVar4;
        }
        CTable_LitLength = (FSE_CTable *)(sVar4 + (long)CTable_LitLength);
        if (op < CTable_LitLength) {
          __assert_fail("op <= oend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xb03,
                        "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                       );
        }
        __return_storage_ptr__->size = (long)CTable_LitLength - (long)oend;
      }
      else {
        __return_storage_ptr__->size = sVar4;
      }
    }
    else {
      __return_storage_ptr__->size = sStack_d0;
    }
  }
  else {
    __return_storage_ptr__->size = sStack_b0;
  }
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_symbolEncodingTypeStats_t
ZSTD_buildSequencesStatistics(
                const seqStore_t* seqStorePtr, size_t nbSeq,
                const ZSTD_fseCTables_t* prevEntropy, ZSTD_fseCTables_t* nextEntropy,
                      BYTE* dst, const BYTE* const dstEnd,
                      ZSTD_strategy strategy, unsigned* countWorkspace,
                      void* entropyWorkspace, size_t entropyWkspSize)
{
    BYTE* const ostart = dst;
    const BYTE* const oend = dstEnd;
    BYTE* op = ostart;
    FSE_CTable* CTable_LitLength = nextEntropy->litlengthCTable;
    FSE_CTable* CTable_OffsetBits = nextEntropy->offcodeCTable;
    FSE_CTable* CTable_MatchLength = nextEntropy->matchlengthCTable;
    const BYTE* const ofCodeTable = seqStorePtr->ofCode;
    const BYTE* const llCodeTable = seqStorePtr->llCode;
    const BYTE* const mlCodeTable = seqStorePtr->mlCode;
    ZSTD_symbolEncodingTypeStats_t stats;

    stats.lastCountSize = 0;
    /* convert length/distances into codes */
    stats.longOffsets = ZSTD_seqToCodes(seqStorePtr);
    assert(op <= oend);
    assert(nbSeq != 0); /* ZSTD_selectEncodingType() divides by nbSeq */
    /* build CTable for Literal Lengths */
    {   unsigned max = MaxLL;
        size_t const mostFrequent = HIST_countFast_wksp(countWorkspace, &max, llCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);   /* can't fail */
        DEBUGLOG(5, "Building LL table");
        nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
        stats.LLtype = ZSTD_selectEncodingType(&nextEntropy->litlength_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        LLFSELog, prevEntropy->litlengthCTable,
                                        LL_defaultNorm, LL_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(set_basic < set_compressed && set_rle < set_compressed);
        assert(!(stats.LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_LitLength, LLFSELog, (symbolEncodingType_e)stats.LLtype,
                countWorkspace, max, llCodeTable, nbSeq,
                LL_defaultNorm, LL_defaultNormLog, MaxLL,
                prevEntropy->litlengthCTable,
                sizeof(prevEntropy->litlengthCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for LitLens failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.LLtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    /* build CTable for Offsets */
    {   unsigned max = MaxOff;
        size_t const mostFrequent = HIST_countFast_wksp(
            countWorkspace, &max, ofCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);  /* can't fail */
        /* We can only use the basic table if max <= DefaultMaxOff, otherwise the offsets are too large */
        ZSTD_defaultPolicy_e const defaultPolicy = (max <= DefaultMaxOff) ? ZSTD_defaultAllowed : ZSTD_defaultDisallowed;
        DEBUGLOG(5, "Building OF table");
        nextEntropy->offcode_repeatMode = prevEntropy->offcode_repeatMode;
        stats.Offtype = ZSTD_selectEncodingType(&nextEntropy->offcode_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        OffFSELog, prevEntropy->offcodeCTable,
                                        OF_defaultNorm, OF_defaultNormLog,
                                        defaultPolicy, strategy);
        assert(!(stats.Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_OffsetBits, OffFSELog, (symbolEncodingType_e)stats.Offtype,
                countWorkspace, max, ofCodeTable, nbSeq,
                OF_defaultNorm, OF_defaultNormLog, DefaultMaxOff,
                prevEntropy->offcodeCTable,
                sizeof(prevEntropy->offcodeCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for Offsets failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.Offtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    /* build CTable for MatchLengths */
    {   unsigned max = MaxML;
        size_t const mostFrequent = HIST_countFast_wksp(
            countWorkspace, &max, mlCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);   /* can't fail */
        DEBUGLOG(5, "Building ML table (remaining space : %i)", (int)(oend-op));
        nextEntropy->matchlength_repeatMode = prevEntropy->matchlength_repeatMode;
        stats.MLtype = ZSTD_selectEncodingType(&nextEntropy->matchlength_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        MLFSELog, prevEntropy->matchlengthCTable,
                                        ML_defaultNorm, ML_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(!(stats.MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_MatchLength, MLFSELog, (symbolEncodingType_e)stats.MLtype,
                countWorkspace, max, mlCodeTable, nbSeq,
                ML_defaultNorm, ML_defaultNormLog, MaxML,
                prevEntropy->matchlengthCTable,
                sizeof(prevEntropy->matchlengthCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for MatchLengths failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.MLtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    stats.size = (size_t)(op-ostart);
    return stats;
}